

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O3

void __thiscall DiceRoller::DiceRoller(DiceRoller *this)

{
  iterator __position;
  int *piVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  int iVar3;
  int local_1c;
  
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  this->diceRolled = piVar1;
  pvVar2 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->history = pvVar2;
  iVar3 = 6;
  do {
    pvVar2 = this->history;
    local_1c = 0;
    __position._M_current =
         (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar2,__position,&local_1c);
    }
    else {
      *__position._M_current = 0;
      (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
    }
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return;
}

Assistant:

DiceRoller::DiceRoller() : diceRolled(new int(0)), history(new std::vector<int>) {
    for (int x = 0; x < 6; x++) {
        history->push_back(0);
    }
}